

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O3

void despot::AEMS::Expand
               (QNode *qnode,BeliefLowerBound *lb,BeliefUpperBound *ub,BeliefMDP *model,
               History *history)

{
  double dVar1;
  QNode *this;
  uint uVar2;
  int iVar3;
  int iVar4;
  VNode *pVVar5;
  Belief *pBVar6;
  log_ostream *plVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  mapped_type *ppVVar9;
  _Rb_tree_node_base *p_Var10;
  _Self __tmp;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  OBS_TYPE obs;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  obss;
  OBS_TYPE local_100;
  uint local_f4;
  QNode *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  _Base_ptr local_d8;
  undefined8 uStack_d0;
  Belief *local_c8;
  BeliefUpperBound *local_c0;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_b8;
  VNode *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  local_98;
  double local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  local_c0 = ub;
  pVVar5 = QNode::parent(qnode);
  local_f4 = QNode::edge(qnode);
  local_b8 = QNode::children(qnode);
  local_b0 = pVVar5;
  pBVar6 = VNode::belief(pVVar5);
  uVar2 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1e])(model,pBVar6,(ulong)uVar2);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = extraout_XMM0_Da;
  uStack_a4 = extraout_XMM0_Db;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar2 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1d])(model,pBVar6,(ulong)uVar2,&local_98);
  local_e8 = (double)CONCAT44(uStack_a4,local_a8);
  uStack_e0 = (double)CONCAT44(uStack_a4,local_a8);
  p_Var10 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = qnode;
  if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_98._M_impl.super__Rb_tree_header) {
    do {
      local_c8 = pBVar6;
      local_100 = *(OBS_TYPE *)(p_Var10 + 1);
      local_d8 = p_Var10[1]._M_parent;
      uStack_d0 = 0;
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
        plVar7 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar7->super_ostream,"[AEMS::Expand] Creating node for obs ",0x25);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)plVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," with weight ",0xd);
        poVar8 = std::ostream::_M_insert<double>((double)local_d8);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      pVVar5 = (VNode *)operator_new(0x98);
      iVar3 = (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1c])
                        (model,local_c8,(ulong)local_f4,local_100);
      iVar4 = VNode::depth(local_b0);
      VNode::VNode(pVVar5,(Belief *)CONCAT44(extraout_var,iVar3),iVar4 + 1,local_f0,local_100);
      pVVar5->likelihood = (double)local_d8;
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
        plVar7 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar7->super_ostream," New node created!",0x12);
        std::ios::widen((char)(plVar7->super_ostream)._vptr_basic_ostream[-3] + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
      }
      ppVVar9 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::operator[](local_b8,&local_100);
      *ppVVar9 = pVVar5;
      pBVar6 = VNode::belief(pVVar5);
      (*lb->_vptr_BeliefLowerBound[3])(lb,pBVar6);
      VNode::lower_bound(pVVar5,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      pBVar6 = VNode::belief(pVVar5);
      (*local_c0->_vptr_BeliefUpperBound[2])(local_c0,pBVar6);
      VNode::upper_bound(pVVar5,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      local_48 = DAT_00192dc8;
      uStack_40 = 0;
      dVar1 = VNode::lower_bound(pVVar5);
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar1;
      local_58._12_4_ = extraout_XMM0_Dd;
      local_68 = DAT_00192dc8;
      uStack_60 = DAT_00192dd0;
      dVar1 = VNode::upper_bound(pVVar5);
      local_e8 = local_e8 + dVar1 * local_68 * (double)local_d8;
      uStack_e0 = uStack_e0 + (double)local_58._0_8_ * local_48 * (double)local_d8;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      pBVar6 = local_c8;
    } while ((_Rb_tree_header *)p_Var10 != &local_98._M_impl.super__Rb_tree_header);
  }
  this = local_f0;
  local_f0->step_reward = (double)CONCAT44(uStack_a4,local_a8);
  QNode::lower_bound(local_f0,uStack_e0);
  QNode::upper_bound(this,local_e8);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void AEMS::Expand(QNode* qnode, BeliefLowerBound* lb, BeliefUpperBound* ub,
	const BeliefMDP* model, History& history) {
	VNode* parent = qnode->parent();
	ACT_TYPE action = qnode->edge();
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const Belief* belief = parent->belief();
	// cout << *belief << endl;

	double step_reward = model->StepReward(belief, qnode->edge());

	map<OBS_TYPE, double> obss;
	model->Observe(belief, qnode->edge(), obss);

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, double>::iterator it = obss.begin(); it != obss.end(); it++) {
		OBS_TYPE obs = it->first;
		double weight = it->second;
		logd << "[AEMS::Expand] Creating node for obs " << obs
			<< " with weight " << weight << endl;
		VNode* vnode = new VNode(model->Tau(belief, action, obs),
			parent->depth() + 1, qnode, obs);
		vnode->likelihood = weight;
		logd << " New node created!" << endl;
		children[obs] = vnode;

		InitLowerBound(vnode, lb, history);
		InitUpperBound(vnode, ub, history);

		lower_bound += weight * Globals::Discount() * vnode->lower_bound();
		upper_bound += weight * Globals::Discount() * vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
}